

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O0

bool __thiscall
duckdb::StringValueScanner::IsRowValid(StringValueScanner *this,CSVIterator *current_iterator)

{
  bool bVar1;
  int iVar2;
  CSVBufferHandle *pCVar3;
  pointer pSVar4;
  undefined4 extraout_var;
  idx_t iVar5;
  CSVPosition *in_RSI;
  bool *in_RDI;
  CSVPosition CVar6;
  bool has_error;
  StringValueResult *tuples;
  templated_unique_single_t scan_finder;
  idx_t result_size;
  shared_ptr<duckdb::CSVBufferHandle,_true> *in_stack_ffffffffffffff10;
  CSVPosition *this_00;
  CSVErrorType in_stack_ffffffffffffff27;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  shared_ptr<duckdb::CSVFileScan,_true> *in_stack_ffffffffffffff40;
  shared_ptr<duckdb::CSVErrorHandler,_true> *in_stack_ffffffffffffff48;
  shared_ptr<duckdb::CSVStateMachine,_true> *in_stack_ffffffffffffff50;
  shared_ptr<duckdb::CSVBufferManager,_true> *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff60;
  CSVIterator *args_6;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar7;
  bool local_1;
  
  args_6 = *(CSVIterator **)(in_RDI + 0x60);
  pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(in_stack_ffffffffffffff10);
  if (args_6 == (CSVIterator *)pCVar3->actual_size) {
    local_1 = false;
  }
  else {
    make_shared_ptr<duckdb::CSVErrorHandler>();
    this_00 = in_RSI;
    make_uniq<duckdb::StringValueScanner,unsigned_long_const&,duckdb::shared_ptr<duckdb::CSVBufferManager,true>const&,duckdb::shared_ptr<duckdb::CSVStateMachine,true>const&,duckdb::shared_ptr<duckdb::CSVErrorHandler,true>,duckdb::shared_ptr<duckdb::CSVFileScan,true>const&,bool,duckdb::CSVIterator&,unsigned_long_const&>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_RDI,args_6,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    shared_ptr<duckdb::CSVErrorHandler,_true>::~shared_ptr
              ((shared_ptr<duckdb::CSVErrorHandler,_true> *)0x1ae791d);
    pSVar4 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)this_00);
    iVar2 = (*(pSVar4->super_BaseScanner)._vptr_BaseScanner[2])();
    pSVar4 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)this_00);
    CVar6 = BaseScanner::GetIteratorPosition(&pSVar4->super_BaseScanner);
    *in_RSI = CVar6;
    bVar7 = 0;
    bVar1 = LineError::HasError((LineError *)0x1ae79c6);
    if ((bVar1) &&
       ((iVar5 = LineError::Size((LineError *)0x1ae79ed), iVar5 != 1 ||
        (bVar1 = LineError::HasErrorType
                           ((LineError *)
                            CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                            in_stack_ffffffffffffff27), !bVar1)))) {
      bVar7 = 1;
    }
    if (((*(long *)(CONCAT44(extraout_var,iVar2) + 0xf0) == 1) ||
        (local_1 = false, (*(byte *)(CONCAT44(extraout_var,iVar2) + 0x398) & 1) != 0)) &&
       (local_1 = false, (bVar7 & 1) == 0)) {
      local_1 = ::std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)0x1ae7aca);
    }
    unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>::
    ~unique_ptr((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                 *)0x1ae7ae8);
  }
  return local_1;
}

Assistant:

bool StringValueScanner::IsRowValid(CSVIterator &current_iterator) const {
	if (iterator.pos.buffer_pos == cur_buffer_handle->actual_size) {
		return false;
	}
	constexpr idx_t result_size = 1;
	auto scan_finder = make_uniq<StringValueScanner>(StringValueScanner::LINE_FINDER_ID, buffer_manager,
	                                                 state_machine_strict, make_shared_ptr<CSVErrorHandler>(),
	                                                 csv_file_scan, false, current_iterator, result_size);
	auto &tuples = scan_finder->ParseChunk();
	current_iterator.pos = scan_finder->GetIteratorPosition();
	bool has_error = false;
	if (tuples.current_errors.HasError()) {
		if (tuples.current_errors.Size() != 1 || !tuples.current_errors.HasErrorType(MAXIMUM_LINE_SIZE)) {
			// We ignore maximum line size errors
			has_error = true;
		}
	}
	return (tuples.number_of_rows == 1 || tuples.first_line_is_comment) && !has_error && tuples.borked_rows.empty();
}